

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O1

ByteData256 *
cfd::core::CryptoUtil::ComputeFastMerkleRoot
          (ByteData256 *__return_storage_ptr__,
          vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *hashes)

{
  pointer puVar1;
  void *pvVar2;
  byte bVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *__x;
  ByteData256 *pBVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  ByteData256 temp_hash;
  ByteData256 inner [33];
  ByteData256 local_388;
  undefined1 local_368 [16];
  pointer puStack_358;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *local_350;
  ByteData256 local_348 [33];
  
  ByteData256::ByteData256(__return_storage_ptr__);
  if (*(long *)(hashes + 8) != *(long *)hashes) {
    lVar10 = 0;
    do {
      ByteData256::ByteData256
                ((ByteData256 *)
                 ((long)&local_348[0].data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar10));
      lVar10 = lVar10 + 0x18;
    } while (lVar10 != 0x318);
    lVar10 = *(long *)hashes;
    if (*(long *)(hashes + 8) == lVar10) {
      uVar8 = 0;
    }
    else {
      uVar5 = 0;
      uVar9 = 0;
      local_350 = hashes;
      do {
        ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  (&local_388.data_,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(lVar10 + uVar5 * 0x18))
        ;
        uVar8 = uVar9 + 1;
        if ((uVar9 & 1) == 0) {
          uVar5 = 0;
        }
        else {
          pBVar7 = local_348;
          uVar9 = 0;
          do {
            MerkleHashSha256Midstate((ByteData256 *)local_368,pBVar7,&local_388);
            puVar1 = local_388.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
            local_388.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)local_368._0_8_;
            local_388.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)local_368._8_8_;
            local_388.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = puStack_358;
            local_368._0_8_ = (pointer)0x0;
            local_368._8_8_ = (pointer)0x0;
            puStack_358 = (pointer)0x0;
            if (puVar1 != (pointer)0x0) {
              operator_delete(puVar1);
            }
            if ((pointer)local_368._0_8_ != (pointer)0x0) {
              operator_delete((void *)local_368._0_8_);
            }
            bVar3 = (byte)uVar9;
            uVar9 = uVar9 + 1;
            pBVar7 = pBVar7 + 1;
          } while ((uVar8 >> (bVar3 & 0x1f) & 2) == 0);
          uVar5 = (ulong)uVar9;
          hashes = local_350;
        }
        ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                  (&local_348[uVar5].data_,&local_388.data_);
        if (local_388.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_388.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        uVar5 = (ulong)uVar8;
        lVar10 = *(long *)hashes;
        uVar6 = (*(long *)(hashes + 8) - lVar10 >> 3) * -0x5555555555555555;
        uVar9 = uVar8;
      } while (uVar5 <= uVar6 && uVar6 - uVar5 != 0);
    }
    uVar9 = 0xffffffff;
    __x = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(local_368 + 8);
    do {
      uVar9 = uVar9 + 1;
      __x = __x + 1;
    } while ((uVar8 >> (uVar9 & 0x1f) & 1) == 0);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&__return_storage_ptr__->data_,__x);
    uVar4 = 1 << ((byte)uVar9 & 0x1f);
    if (uVar8 != uVar4) {
      do {
        uVar8 = uVar4 + uVar8;
        uVar4 = uVar9 + 1;
        if ((uVar8 >> (uVar4 & 0x1f) & 1) == 0) {
          pBVar7 = local_348 + (long)(int)uVar9 + 1;
          do {
            MerkleHashSha256Midstate(&local_388,pBVar7,__return_storage_ptr__);
            puVar1 = (__return_storage_ptr__->data_).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
            (__return_storage_ptr__->data_).
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start =
                 local_388.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start;
            (__return_storage_ptr__->data_).
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_388.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
            (__return_storage_ptr__->data_).
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 local_388.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
            local_388.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_388.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_388.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            if (puVar1 != (pointer)0x0) {
              operator_delete(puVar1);
            }
            if (local_388.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_388.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
            uVar4 = uVar4 + 1;
            pBVar7 = pBVar7 + 1;
          } while ((uVar8 >> (uVar4 & 0x1f) & 1) == 0);
        }
        uVar9 = uVar4;
        uVar4 = 1 << ((byte)uVar9 & 0x1f);
      } while (uVar8 != uVar4);
    }
    lVar10 = 0x300;
    do {
      pvVar2 = *(void **)((long)&local_348[0].data_.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start + lVar10);
      if (pvVar2 != (void *)0x0) {
        operator_delete(pvVar2);
      }
      lVar10 = lVar10 + -0x18;
    } while (lVar10 != -0x18);
  }
  return __return_storage_ptr__;
}

Assistant:

ByteData256 CryptoUtil::ComputeFastMerkleRoot(
    const std::vector<ByteData256> &hashes) {
  static constexpr uint32_t kUintValue1 = 1;
  ByteData256 result_hash;
  if (hashes.size() == 0) return result_hash;

  // inner is an array of eagerly computed subtree hashes, indexed by tree
  // level (0 being the leaves).
  // For example, when count is 25 (11001 in binary), inner[4] is the hash of
  // the first 16 leaves, inner[3] of the next 8 leaves, and inner[0] equal to
  // the last leaf. The other inner entries are undefined.
  //
  // First process all leaves into 'inner' values.
  ByteData256 inner[33];
  uint32_t count = 0;
  int level;
  while (count < hashes.size()) {
    ByteData256 temp_hash = hashes[count];
    ++count;
    // For each of the lower bits in count that are 0, do 1 step. Each
    // corresponds to an inner value that existed before processing the
    // current leaf, and each needs a hash to combine it.
    level = 0;
    while ((count & (kUintValue1 << level)) == 0) {
      temp_hash = MerkleHashSha256Midstate(inner[level], temp_hash);
      ++level;
    }
    // Store the resulting hash at inner position level.
    inner[level] = temp_hash;
  }

  // Do a final 'sweep' over the rightmost branch of the tree to process
  // odd levels, and reduce everything to a single top value.
  // Level is the level (counted from the bottom) up to which we've sweeped.
  //
  // As long as bit number level in count is zero, skip it. It means there
  // is nothing left at this level.
  level = 0;
  while ((count & (kUintValue1 << level)) == 0) {
    ++level;
  }
  result_hash = inner[level];

  while (count != (kUintValue1 << level)) {
    // If we reach this point, hash is an inner value that is not the top.
    // We combine it with itself (Bitcoin's special rule for odd levels in
    // the tree) to produce a higher level one.

    // Increment count to the value it would have if two entries at this
    // level had existed and propagate the result upwards accordingly.
    count += (kUintValue1 << level);
    ++level;
    while ((count & (kUintValue1 << level)) == 0) {
      result_hash = MerkleHashSha256Midstate(inner[level], result_hash);
      ++level;
    }
  }
  return result_hash;
}